

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O1

void parsetimeunits(void *x,t_float amount,t_symbol *unitname,t_float *unit,int *samps)

{
  char *__s1;
  char *__s1_00;
  int iVar1;
  float fVar2;
  t_float tVar3;
  
  __s1_00 = unitname->s_name;
  tVar3 = (t_float)(~-(uint)(0.0 < amount) & 0x3f800000 | (uint)amount & -(uint)(0.0 < amount));
  if (((*__s1_00 != 'p') || (__s1_00[1] != 'e')) || (__s1_00[2] != 'r')) {
    iVar1 = strcmp(__s1_00,"millisecond");
    if ((iVar1 == 0) || (iVar1 = strcmp(__s1_00,"msec"), iVar1 == 0)) {
      *samps = 0;
    }
    else {
      iVar1 = strncmp(__s1_00,"sec",3);
      if (iVar1 == 0) {
        *samps = 0;
        tVar3 = tVar3 * 1000.0;
      }
      else {
        iVar1 = strncmp(__s1_00,"min",3);
        if (iVar1 == 0) {
          *samps = 0;
          tVar3 = tVar3 * 60000.0;
        }
        else {
          iVar1 = strncmp(__s1_00,"sam",3);
          if (iVar1 != 0) goto LAB_0018fe21;
          *samps = 1;
        }
      }
    }
    goto LAB_0018fe49;
  }
  __s1 = __s1_00 + 3;
  iVar1 = strcmp(__s1,"millisecond");
  if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"msec"), iVar1 == 0)) {
    *samps = 0;
LAB_0018fe8c:
    fVar2 = 1.0;
  }
  else {
    iVar1 = strncmp(__s1,"sec",3);
    if (iVar1 == 0) {
      *samps = 0;
      fVar2 = 1000.0;
    }
    else {
      iVar1 = strncmp(__s1,"min",3);
      if (iVar1 != 0) {
        iVar1 = strncmp(__s1,"sam",3);
        if (iVar1 != 0) {
LAB_0018fe21:
          if (*__s1_00 == '\0') {
            pd_error(x,"tempo setting needs time unit (\'sec\', \'samp\', \'permin\', etc.");
          }
          else {
            pd_error(x,"%s: unknown time unit",__s1_00);
          }
          *unit = 1.0;
          *samps = 0;
          return;
        }
        *samps = 1;
        goto LAB_0018fe8c;
      }
      *samps = 0;
      fVar2 = 60000.0;
    }
  }
  tVar3 = fVar2 / tVar3;
LAB_0018fe49:
  *unit = tVar3;
  return;
}

Assistant:

void parsetimeunits(void *x, t_float amount, t_symbol *unitname,
    t_float *unit, int *samps)
{
    const char *s = unitname->s_name;
    if (amount <= 0)
        amount = 1;
    if (s[0] == 'p' && s[1] == 'e' && s[2] == 'r')  /* starts with 'per' */
    {
        const char *s2 = s+3;
        if (!strcmp(s2, "millisecond") || !strcmp(s2, "msec"))  /* msec */
            *samps = 0, *unit = 1./amount;
        else if (!strncmp(s2, "sec", 3))        /* seconds */
            *samps = 0, *unit = 1000./amount;
        else if (!strncmp(s2, "min", 3))        /* minutes */
            *samps = 0, *unit = 60000./amount;
        else if (!strncmp(s2, "sam", 3))        /* samples */
            *samps = 1, *unit = 1./amount;
        else goto fail;
    }
    else
    {
            /* empty string defaults to msec */
        if (!strcmp(s, "millisecond") || !strcmp(s, "msec"))
            *samps = 0, *unit = amount;
        else if (!strncmp(s, "sec", 3))
            *samps = 0, *unit = 1000.*amount;
        else if (!strncmp(s, "min", 3))
            *samps = 0, *unit = 60000.*amount;
        else if (!strncmp(s, "sam", 3))
            *samps = 1, *unit = amount;
        else
        {
        fail:
                /* empty time unit specification defaults to 1 msec for
                back compatibility, since it's possible someone threw a
                float argument to timer which had previously been ignored. */
            if (*s)
                pd_error(x, "%s: unknown time unit", s);
            else pd_error(x,
                "tempo setting needs time unit ('sec', 'samp', 'permin', etc.");
            *unit = 1;
            *samps = 0;
        }
    }
}